

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O2

Literal * __thiscall
wasm::ExpressionRunner<wasm::PrecomputingExpressionRunner>::truncateForPacking
          (Literal *__return_storage_ptr__,
          ExpressionRunner<wasm::PrecomputingExpressionRunner> *this,Literal *value,Field *field)

{
  uint uVar1;
  anon_union_16_6_1532cd5a_for_Literal_0 local_38;
  undefined8 local_28;
  
  if ((field->type).id == 2) {
    uVar1 = Literal::geti32(value);
    if (field->packedType == i16) {
      local_38.i32 = uVar1 & 0xffff;
      local_28 = 2;
      Literal::operator=(value,(Literal *)&local_38.func);
    }
    else {
      if (field->packedType != i8) goto LAB_00b13627;
      local_38.i32 = uVar1 & 0xff;
      local_28 = 2;
      Literal::operator=(value,(Literal *)&local_38.func);
    }
    Literal::~Literal((Literal *)&local_38.func);
  }
LAB_00b13627:
  Literal::Literal(__return_storage_ptr__,value);
  return __return_storage_ptr__;
}

Assistant:

Literal truncateForPacking(Literal value, const Field& field) {
    if (field.type == Type::i32) {
      int32_t c = value.geti32();
      if (field.packedType == Field::i8) {
        value = Literal(c & 0xff);
      } else if (field.packedType == Field::i16) {
        value = Literal(c & 0xffff);
      }
    }
    return value;
  }